

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

agr * __thiscall
agr::except_error_func<std::out_of_range>(agr *this,string *beg,string *var,string *end)

{
  int iVar1;
  ostream *poVar2;
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_59;
  string local_58 [48];
  string *local_28;
  string *end_local;
  string *var_local;
  string *beg_local;
  
  local_28 = end;
  end_local = var;
  var_local = beg;
  beg_local = (string *)this;
  if (except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
      ::oss_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                                 ::oss_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)
                 &except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                  ::oss_abi_cxx11_);
      __cxa_atexit(std::__cxx11::ostringstream::~ostringstream,
                   &except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                    ::oss_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                           ::oss_abi_cxx11_);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"",&local_59);
  std::__cxx11::ostringstream::str
            ((string *)
             &except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
              ::oss_abi_cxx11_);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::ios::clear((long)&except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                         ::oss_abi_cxx11_ +
                  *(long *)(except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                            ::oss_abi_cxx11_ + -0x18),0);
  poVar2 = std::operator<<((ostream *)
                           &except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                            ::oss_abi_cxx11_,"\x1b[31m");
  poVar2 = std::operator<<(poVar2,(string *)var_local);
  s_abi_cxx11_(&local_80," \"",2);
  poVar2 = std::operator<<(poVar2,(string *)&local_80);
  poVar2 = std::operator<<(poVar2,"\x1b[1m");
  poVar2 = std::operator<<(poVar2,(string *)var);
  poVar2 = std::operator<<(poVar2,"\x1b[22m");
  s_abi_cxx11_(&local_a0,"\" ",2);
  poVar2 = std::operator<<(poVar2,(string *)&local_a0);
  poVar2 = std::operator<<(poVar2,(string *)local_28);
  std::operator<<(poVar2,"\x1b[39m");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::ostringstream::str();
  std::out_of_range::out_of_range((out_of_range *)this,local_c0);
  std::__cxx11::string::~string(local_c0);
  return this;
}

Assistant:

inline T_err except_error_func( const std::string& beg = "", std::string var = nullptr, const std::string& end = "" )
   {
    using namespace std::literals::string_literals;

    static std::ostringstream oss;
    oss.str( "" );
    oss.clear();
    oss << "\033[31m" << beg << " \""s << "\033[1m" << var << "\033[22m" << "\" "s << end << "\033[39m";

    return T_err( oss.str() ); 
   }